

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder__preinit(ma_decoder_read_proc onRead,ma_decoder_seek_proc onSeek,
                             ma_decoder_tell_proc onTell,void *pUserData,ma_decoder_config *pConfig,
                             ma_decoder *pDecoder)

{
  ma_data_source_config pDataSource;
  ma_decoding_backend_vtable **in_RCX;
  undefined8 in_RDX;
  _func_void_void_ptr_void_ptr *in_RSI;
  _func_void_ptr_void_ptr_size_t_void_ptr *in_RDI;
  ma_decoder_config *in_R9;
  ma_data_source_config dataSourceConfig;
  ma_result result;
  uint in_stack_ffffffffffffffb0;
  ma_result local_14;
  
  if (in_R9 == (ma_decoder_config *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_R9 != (ma_decoder_config *)0x0) {
      memset(in_R9,0,0x228);
    }
    pDataSource = ma_data_source_config_init();
    local_14 = ma_data_source_init((ma_data_source_config *)&g_ma_decoder_data_source_vtable,
                                   pDataSource.vtable);
    if (local_14 == MA_SUCCESS) {
      (in_R9->allocationCallbacks).onRealloc = in_RDI;
      (in_R9->allocationCallbacks).onFree = in_RSI;
      in_R9->encodingFormat = (int)in_RDX;
      in_R9->seekPointCount = (int)((ulong)in_RDX >> 0x20);
      in_R9->ppCustomBackendVTables = in_RCX;
      local_14 = ma_decoder__init_allocation_callbacks
                           (in_R9,(ma_decoder *)(ulong)in_stack_ffffffffffffffb0);
      if (local_14 == MA_SUCCESS) {
        local_14 = MA_SUCCESS;
      }
      else {
        ma_data_source_uninit(in_R9);
      }
    }
  }
  return local_14;
}

Assistant:

static ma_result ma_decoder__preinit(ma_decoder_read_proc onRead, ma_decoder_seek_proc onSeek, ma_decoder_tell_proc onTell, void* pUserData, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_data_source_config dataSourceConfig;

    MA_ASSERT(pConfig != NULL);

    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pDecoder);

    dataSourceConfig = ma_data_source_config_init();
    dataSourceConfig.vtable = &g_ma_decoder_data_source_vtable;

    result = ma_data_source_init(&dataSourceConfig, &pDecoder->ds);
    if (result != MA_SUCCESS) {
        return result;
    }

    pDecoder->onRead    = onRead;
    pDecoder->onSeek    = onSeek;
    pDecoder->onTell    = onTell;
    pDecoder->pUserData = pUserData;

    result = ma_decoder__init_allocation_callbacks(pConfig, pDecoder);
    if (result != MA_SUCCESS) {
        ma_data_source_uninit(&pDecoder->ds);
        return result;
    }

    return MA_SUCCESS;
}